

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::BuildMessage
          (DescriptorBuilder *this,DescriptorProto *proto,Descriptor *parent,Descriptor *result)

{
  Tables *this_00;
  Symbol symbol;
  Descriptor *parent_00;
  Descriptor *proto_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  string *psVar5;
  FieldDescriptorProto *pFVar6;
  DescriptorProto *proto_01;
  EnumDescriptorProto *proto_02;
  DescriptorProto_ExtensionRange *pDVar7;
  MessageOptions *orig_options;
  string *psVar8;
  SubstituteArg *in_stack_fffffffffffffa28;
  SubstituteArg *this_01;
  string *local_4c8;
  SubstituteArg local_4b8;
  SubstituteArg local_488;
  SubstituteArg local_458;
  SubstituteArg local_428;
  SubstituteArg local_3f8;
  SubstituteArg local_3c8;
  SubstituteArg local_398;
  SubstituteArg local_368;
  SubstituteArg local_338;
  SubstituteArg local_308;
  string local_2d8;
  ExtensionRange *local_2b8;
  ExtensionRange *range2;
  ExtensionRange *pEStack_2a8;
  int j_1;
  ExtensionRange *range1;
  int i_6;
  SubstituteArg local_290;
  SubstituteArg local_260;
  SubstituteArg local_230;
  SubstituteArg local_200;
  SubstituteArg local_1d0;
  SubstituteArg local_1a0;
  SubstituteArg local_170;
  SubstituteArg local_140;
  SubstituteArg local_110;
  SubstituteArg local_e0;
  string local_b0;
  ExtensionRange *local_90;
  ExtensionRange *range;
  FieldDescriptor *pFStack_80;
  int j;
  FieldDescriptor *field;
  undefined1 auStack_70 [4];
  int i_5;
  anon_union_8_7_bfa3a334_for_Symbol_2 local_68;
  int local_5c;
  int local_58;
  int i_4;
  int i_3;
  int i_2;
  int i_1;
  int i;
  string *full_name;
  string *scope;
  Descriptor *result_local;
  Descriptor *parent_local;
  DescriptorProto *proto_local;
  DescriptorBuilder *this_local;
  
  scope = (string *)result;
  result_local = parent;
  parent_local = (Descriptor *)proto;
  proto_local = (DescriptorProto *)this;
  if (parent == (Descriptor *)0x0) {
    local_4c8 = FileDescriptor::package_abi_cxx11_(this->file_);
  }
  else {
    local_4c8 = Descriptor::full_name_abi_cxx11_(parent);
  }
  full_name = local_4c8;
  _i_1 = DescriptorPool::Tables::AllocateString(this->tables_,local_4c8);
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    std::__cxx11::string::append((ulong)_i_1,'\x01');
  }
  psVar5 = _i_1;
  DescriptorProto::name_abi_cxx11_((DescriptorProto *)parent_local);
  std::__cxx11::string::append((string *)psVar5);
  psVar5 = DescriptorProto::name_abi_cxx11_((DescriptorProto *)parent_local);
  ValidateSymbolName(this,psVar5,_i_1,(Message *)parent_local);
  this_00 = this->tables_;
  psVar5 = DescriptorProto::name_abi_cxx11_((DescriptorProto *)parent_local);
  psVar5 = DescriptorPool::Tables::AllocateString(this_00,psVar5);
  *(string **)scope = psVar5;
  scope->_M_string_length = (size_type)_i_1;
  (scope->field_2)._M_allocated_capacity = (size_type)this->file_;
  *(Descriptor **)((long)&scope->field_2 + 8) = result_local;
  *(undefined1 *)&scope[1]._M_string_length = 0;
  *(undefined1 *)((long)&scope[1]._M_string_length + 1) = 0;
  iVar2 = DescriptorProto::field_size((DescriptorProto *)parent_local);
  *(int *)((long)&scope[1]._M_string_length + 4) = iVar2;
  iVar2 = DescriptorProto::field_size((DescriptorProto *)parent_local);
  AllocateArray<google::protobuf::FieldDescriptor>
            (this,iVar2,(FieldDescriptor **)&scope[1].field_2._M_allocated_capacity);
  for (i_2 = 0; iVar2 = i_2, iVar3 = DescriptorProto::field_size((DescriptorProto *)parent_local),
      iVar2 < iVar3; i_2 = i_2 + 1) {
    pFVar6 = DescriptorProto::field((DescriptorProto *)parent_local,i_2);
    BuildField(this,pFVar6,(Descriptor *)scope,
               (FieldDescriptor *)(scope[1].field_2._M_allocated_capacity + (long)i_2 * 0x78));
  }
  iVar2 = DescriptorProto::nested_type_size((DescriptorProto *)parent_local);
  *(int *)((long)&scope[1].field_2 + 8) = iVar2;
  iVar2 = DescriptorProto::nested_type_size((DescriptorProto *)parent_local);
  AllocateArray<google::protobuf::Descriptor>(this,iVar2,(Descriptor **)(scope + 2));
  for (i_3 = 0; iVar2 = i_3,
      iVar3 = DescriptorProto::nested_type_size((DescriptorProto *)parent_local), iVar2 < iVar3;
      i_3 = i_3 + 1) {
    proto_01 = DescriptorProto::nested_type((DescriptorProto *)parent_local,i_3);
    BuildMessage(this,proto_01,(Descriptor *)scope,
                 (Descriptor *)(*(long *)(scope + 2) + (long)i_3 * 0x78));
  }
  iVar2 = DescriptorProto::enum_type_size((DescriptorProto *)parent_local);
  *(int *)&scope[2]._M_string_length = iVar2;
  iVar2 = DescriptorProto::enum_type_size((DescriptorProto *)parent_local);
  AllocateArray<google::protobuf::EnumDescriptor>
            (this,iVar2,(EnumDescriptor **)&scope[2].field_2._M_allocated_capacity);
  for (i_4 = 0; iVar2 = i_4,
      iVar3 = DescriptorProto::enum_type_size((DescriptorProto *)parent_local), iVar2 < iVar3;
      i_4 = i_4 + 1) {
    proto_02 = DescriptorProto::enum_type((DescriptorProto *)parent_local,i_4);
    BuildEnum(this,proto_02,(Descriptor *)scope,
              (EnumDescriptor *)(scope[2].field_2._M_allocated_capacity + (long)i_4 * 0x38));
  }
  iVar2 = DescriptorProto::extension_range_size((DescriptorProto *)parent_local);
  *(int *)((long)&scope[2].field_2 + 8) = iVar2;
  iVar2 = DescriptorProto::extension_range_size((DescriptorProto *)parent_local);
  AllocateArray<google::protobuf::Descriptor::ExtensionRange>
            (this,iVar2,(ExtensionRange **)(scope + 3));
  for (local_58 = 0; iVar2 = local_58,
      iVar3 = DescriptorProto::extension_range_size((DescriptorProto *)parent_local), iVar2 < iVar3;
      local_58 = local_58 + 1) {
    pDVar7 = DescriptorProto::extension_range((DescriptorProto *)parent_local,local_58);
    BuildExtensionRange(this,pDVar7,(Descriptor *)scope,
                        (ExtensionRange *)(*(long *)(scope + 3) + (long)local_58 * 8));
  }
  iVar2 = DescriptorProto::extension_size((DescriptorProto *)parent_local);
  *(int *)&scope[3]._M_string_length = iVar2;
  iVar2 = DescriptorProto::extension_size((DescriptorProto *)parent_local);
  AllocateArray<google::protobuf::FieldDescriptor>
            (this,iVar2,(FieldDescriptor **)&scope[3].field_2._M_allocated_capacity);
  for (local_5c = 0; iVar2 = local_5c,
      iVar3 = DescriptorProto::extension_size((DescriptorProto *)parent_local), iVar2 < iVar3;
      local_5c = local_5c + 1) {
    pFVar6 = DescriptorProto::extension((DescriptorProto *)parent_local,local_5c);
    BuildExtension(this,pFVar6,(Descriptor *)scope,
                   (FieldDescriptor *)
                   (scope[3].field_2._M_allocated_capacity + (long)local_5c * 0x78));
  }
  bVar1 = DescriptorProto::has_options((DescriptorProto *)parent_local);
  if (bVar1) {
    orig_options = DescriptorProto::options((DescriptorProto *)parent_local);
    AllocateOptions<google::protobuf::Descriptor>(this,orig_options,(Descriptor *)scope);
  }
  else {
    *(undefined8 *)(scope + 1) = 0;
  }
  psVar5 = Descriptor::full_name_abi_cxx11_((Descriptor *)scope);
  parent_00 = result_local;
  psVar8 = Descriptor::name_abi_cxx11_((Descriptor *)scope);
  proto_00 = parent_local;
  anon_unknown_1::Symbol::Symbol((Symbol *)auStack_70,(Descriptor *)scope);
  symbol.field_1.descriptor = local_68.descriptor;
  symbol.type = (Type)auStack_70;
  symbol._4_4_ = i_5;
  AddSymbol(this,psVar5,parent_00,psVar8,(Message *)proto_00,symbol);
  for (field._4_4_ = 0; iVar2 = field._4_4_, iVar3 = Descriptor::field_count((Descriptor *)scope),
      iVar2 < iVar3; field._4_4_ = field._4_4_ + 1) {
    pFStack_80 = Descriptor::field((Descriptor *)scope,field._4_4_);
    for (range._4_4_ = 0; iVar2 = range._4_4_,
        iVar3 = Descriptor::extension_range_count((Descriptor *)scope), iVar2 < iVar3;
        range._4_4_ = range._4_4_ + 1) {
      local_90 = Descriptor::extension_range((Descriptor *)scope,range._4_4_);
      iVar2 = local_90->start;
      iVar3 = FieldDescriptor::number(pFStack_80);
      if ((iVar2 <= iVar3) && (iVar2 = FieldDescriptor::number(pFStack_80), iVar2 < local_90->end))
      {
        psVar5 = FieldDescriptor::full_name_abi_cxx11_(pFStack_80);
        pDVar7 = DescriptorProto::extension_range((DescriptorProto *)parent_local,range._4_4_);
        strings::internal::SubstituteArg::SubstituteArg(&local_e0,local_90->start);
        strings::internal::SubstituteArg::SubstituteArg(&local_110,local_90->end + -1);
        psVar8 = FieldDescriptor::name_abi_cxx11_(pFStack_80);
        strings::internal::SubstituteArg::SubstituteArg(&local_140,psVar8);
        iVar2 = FieldDescriptor::number(pFStack_80);
        strings::internal::SubstituteArg::SubstituteArg(&local_170,iVar2);
        strings::internal::SubstituteArg::SubstituteArg(&local_1a0);
        strings::internal::SubstituteArg::SubstituteArg(&local_1d0);
        strings::internal::SubstituteArg::SubstituteArg(&local_200);
        strings::internal::SubstituteArg::SubstituteArg(&local_230);
        strings::internal::SubstituteArg::SubstituteArg(&local_260);
        strings::internal::SubstituteArg::SubstituteArg(&local_290);
        strings::Substitute_abi_cxx11_
                  (&local_b0,(strings *)"Extension range $0 to $1 includes field \"$2\" ($3).",
                   (char *)&local_e0,&local_110,&local_140,&local_170,&local_1a0,&local_1d0,
                   &local_200,&local_230,&local_260,&local_290,in_stack_fffffffffffffa28);
        AddError(this,psVar5,&pDVar7->super_Message,NUMBER,&local_b0);
        std::__cxx11::string::~string((string *)&local_b0);
      }
    }
  }
  for (range1._0_4_ = 0; iVar2 = (int)range1,
      iVar3 = Descriptor::extension_range_count((Descriptor *)scope), iVar2 < iVar3;
      range1._0_4_ = (int)range1 + 1) {
    pEStack_2a8 = Descriptor::extension_range((Descriptor *)scope,(int)range1);
    range2._4_4_ = (int)range1;
    while( true ) {
      range2._4_4_ = range2._4_4_ + 1;
      iVar2 = range2._4_4_;
      iVar3 = Descriptor::extension_range_count((Descriptor *)scope);
      if (iVar3 <= iVar2) break;
      local_2b8 = Descriptor::extension_range((Descriptor *)scope,range2._4_4_);
      if ((local_2b8->start < pEStack_2a8->end) && (pEStack_2a8->start < local_2b8->end)) {
        psVar5 = Descriptor::full_name_abi_cxx11_((Descriptor *)scope);
        pDVar7 = DescriptorProto::extension_range((DescriptorProto *)parent_local,range2._4_4_);
        strings::internal::SubstituteArg::SubstituteArg(&local_308,local_2b8->start);
        strings::internal::SubstituteArg::SubstituteArg(&local_338,local_2b8->end + -1);
        strings::internal::SubstituteArg::SubstituteArg(&local_368,pEStack_2a8->start);
        strings::internal::SubstituteArg::SubstituteArg(&local_398,pEStack_2a8->end + -1);
        strings::internal::SubstituteArg::SubstituteArg(&local_3c8);
        strings::internal::SubstituteArg::SubstituteArg(&local_3f8);
        strings::internal::SubstituteArg::SubstituteArg(&local_428);
        this_01 = &local_458;
        strings::internal::SubstituteArg::SubstituteArg(this_01);
        strings::internal::SubstituteArg::SubstituteArg(&local_488);
        strings::internal::SubstituteArg::SubstituteArg(&local_4b8);
        strings::Substitute_abi_cxx11_
                  (&local_2d8,
                   (strings *)
                   "Extension range $0 to $1 overlaps with already-defined range $2 to $3.",
                   (char *)&local_308,&local_338,&local_368,&local_398,&local_3c8,&local_3f8,
                   &local_428,this_01,&local_488,&local_4b8,this_01);
        AddError(this,psVar5,&pDVar7->super_Message,NUMBER,&local_2d8);
        std::__cxx11::string::~string((string *)&local_2d8);
      }
    }
  }
  return;
}

Assistant:

void DescriptorBuilder::BuildMessage(const DescriptorProto& proto,
                                     const Descriptor* parent,
                                     Descriptor* result) {
  const string& scope = (parent == NULL) ?
    file_->package() : parent->full_name();
  string* full_name = tables_->AllocateString(scope);
  if (!full_name->empty()) full_name->append(1, '.');
  full_name->append(proto.name());

  ValidateSymbolName(proto.name(), *full_name, proto);

  result->name_            = tables_->AllocateString(proto.name());
  result->full_name_       = full_name;
  result->file_            = file_;
  result->containing_type_ = parent;
  result->is_placeholder_  = false;
  result->is_unqualified_placeholder_ = false;

  BUILD_ARRAY(proto, result, field          , BuildField         , result);
  BUILD_ARRAY(proto, result, nested_type    , BuildMessage       , result);
  BUILD_ARRAY(proto, result, enum_type      , BuildEnum          , result);
  BUILD_ARRAY(proto, result, extension_range, BuildExtensionRange, result);
  BUILD_ARRAY(proto, result, extension      , BuildExtension     , result);

  // Copy options.
  if (!proto.has_options()) {
    result->options_ = NULL;  // Will set to default_instance later.
  } else {
    AllocateOptions(proto.options(), result);
  }

  AddSymbol(result->full_name(), parent, result->name(),
            proto, Symbol(result));

  // Check that no fields have numbers in extension ranges.
  for (int i = 0; i < result->field_count(); i++) {
    const FieldDescriptor* field = result->field(i);
    for (int j = 0; j < result->extension_range_count(); j++) {
      const Descriptor::ExtensionRange* range = result->extension_range(j);
      if (range->start <= field->number() && field->number() < range->end) {
        AddError(field->full_name(), proto.extension_range(j),
                 DescriptorPool::ErrorCollector::NUMBER,
                 strings::Substitute(
                   "Extension range $0 to $1 includes field \"$2\" ($3).",
                   range->start, range->end - 1,
                   field->name(), field->number()));
      }
    }
  }

  // Check that extension ranges don't overlap.
  for (int i = 0; i < result->extension_range_count(); i++) {
    const Descriptor::ExtensionRange* range1 = result->extension_range(i);
    for (int j = i + 1; j < result->extension_range_count(); j++) {
      const Descriptor::ExtensionRange* range2 = result->extension_range(j);
      if (range1->end > range2->start && range2->end > range1->start) {
        AddError(result->full_name(), proto.extension_range(j),
                 DescriptorPool::ErrorCollector::NUMBER,
                 strings::Substitute("Extension range $0 to $1 overlaps with "
                                     "already-defined range $2 to $3.",
                                     range2->start, range2->end - 1,
                                     range1->start, range1->end - 1));
      }
    }
  }
}